

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O3

void value_type_destroy(value v)

{
  object obj;
  type_id id_00;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t sVar6;
  type_id id;
  
  if (v != (value)0x0) {
    id = 0x14;
    sVar3 = value_size(v);
    value_to((value)((long)v + (sVar3 - 4)),&id,4);
    id_00 = id;
    iVar1 = type_id_array(id);
    if (iVar1 == 0) {
      sVar3 = value_type_count(v);
      pvVar5 = value_data(v);
      if (sVar3 != 0) {
        sVar6 = 0;
        do {
          value_type_destroy(*(value *)((long)pvVar5 + sVar6 * 8));
          sVar6 = sVar6 + 1;
        } while (sVar3 != sVar6);
      }
    }
    else {
      iVar1 = type_id_map(id_00);
      if (iVar1 == 0) {
        sVar3 = value_type_count(v);
        pvVar5 = value_data(v);
        if (sVar3 != 0) {
          sVar6 = 0;
          do {
            value_type_destroy(*(value *)((long)pvVar5 + sVar6 * 8));
            sVar6 = sVar6 + 1;
          } while (sVar3 != sVar6);
        }
      }
      else {
        iVar1 = type_id_future(id_00);
        if (iVar1 == 0) {
          puVar4 = (undefined8 *)value_data(v);
          future_destroy((future_conflict)*puVar4);
        }
        else {
          iVar1 = type_id_function(id_00);
          if (iVar1 == 0) {
            puVar4 = (undefined8 *)value_data(v);
            function_destroy((function_conflict)*puVar4);
          }
          else {
            iVar1 = type_id_class(id_00);
            if (iVar1 == 0) {
              puVar4 = (undefined8 *)value_data(v);
              class_destroy((klass)*puVar4);
            }
            else {
              iVar1 = type_id_object(id_00);
              if (iVar1 == 0) {
                puVar4 = (undefined8 *)value_data(v);
                obj = (object)*puVar4;
                uVar2 = object_delete(obj);
                if (uVar2 != 0) {
                  log_write_impl_va("metacall",0x2d6,"value_type_destroy",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_value_type.c"
                                    ,LOG_LEVEL_ERROR,
                                    "Invalid deletion of object <%p>, destructor return error code %d"
                                    ,obj,(ulong)uVar2);
                }
                object_destroy(obj);
              }
              else {
                iVar1 = type_id_exception(id_00);
                if (iVar1 == 0) {
                  puVar4 = (undefined8 *)value_data(v);
                  exception_destroy((exception)*puVar4);
                }
                else {
                  iVar1 = type_id_throwable(id_00);
                  if (iVar1 == 0) {
                    puVar4 = (undefined8 *)value_data(v);
                    throwable_destroy((throwable)*puVar4);
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar1 = type_id_invalid(id_00);
    if (iVar1 == 0) {
      log_write_impl_va("metacall",0x2f2,"value_type_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_value_type.c"
                        ,LOG_LEVEL_ERROR,"Trying to destroy an invalid value <%p>",v);
    }
    else {
      value_destroy(v);
    }
  }
  return;
}

Assistant:

void value_type_destroy(value v)
{
	/* TODO: Disable logs here until log is completely thread safe and async signal safe */

	if (v != NULL)
	{
		type_id id = value_type_id(v);

		if (type_id_array(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value *v_array = value_to_array(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy array value <%p> of size %u", (void *)v, size); */

			for (index = 0; index < size; ++index)
			{
				value_type_destroy(v_array[index]);
			}
		}
		else if (type_id_map(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value *v_map = value_to_map(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy map value <%p> of size %u", (void *)v, size); */

			for (index = 0; index < size; ++index)
			{
				value_type_destroy(v_map[index]);
			}
		}
		else if (type_id_future(id) == 0)
		{
			future f = value_to_future(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy future value <%p>", (void *)v); */

			future_destroy(f);
		}
		else if (type_id_function(id) == 0)
		{
			function f = value_to_function(v);

			/*
			const char *name = function_name(f);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous function <%p> value <%p>", (void *)f, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy function %s <%p> value <%p>", name, (void *)f, (void *)v);
			}
			*/

			function_destroy(f);
		}
		else if (type_id_class(id) == 0)
		{
			klass c = value_to_class(v);

			/*
			const char *name = class_name(c);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous class <%p> value <%p>", (void *)c, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy class %s <%p> value <%p>", name, (void *)c, (void *)v);
			}
			*/

			class_destroy(c);
		}
		else if (type_id_object(id) == 0)
		{
			object o = value_to_object(v);
			int delete_return;

			/*
			const char *name = object_name(o);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous object <%p> value <%p>", (void *)o, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy object %s <%p> value <%p>", name, (void *)o, (void *)v);
			}
			*/

			delete_return = object_delete(o);

			if (delete_return != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid deletion of object <%p>, destructor return error code %d", (void *)o, delete_return);
			}

			object_destroy(o);
		}
		else if (type_id_exception(id) == 0)
		{
			exception ex = value_to_exception(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy exception value <%p>", (void *)v); */

			exception_destroy(ex);
		}
		else if (type_id_throwable(id) == 0)
		{
			throwable th = value_to_throwable(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy throwable value <%p> containing the value <%p>", (void *)v, (void *)throwable_value(th)); */

			throwable_destroy(th);
		}

		if (type_id_invalid(id) != 0)
		{
			value_destroy(v);
		}
		else
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trying to destroy an invalid value <%p>", (void *)v);
		}
	}
}